

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O0

Machine * getStructure(Machine *__return_storage_ptr__,Machine *m,Register r,Functor *f)

{
  Addr a;
  bool bVar1;
  mapped_type *pmVar2;
  Addr AVar3;
  Functor local_3c0;
  Hcell local_398;
  key_type local_364;
  Addr local_360 [2];
  AddrTag local_348;
  int local_340;
  Addr local_33c;
  int local_330;
  undefined4 uStack_32c;
  AddrTag local_328;
  Machine local_320;
  Machine local_2b0;
  key_type local_23c;
  Functor local_238;
  Hcell local_210;
  int local_1dc;
  Hcell local_1d8;
  int local_1a8;
  undefined4 uStack_1a4;
  AddrTag local_1a0;
  int local_198;
  undefined4 uStack_194;
  AddrTag local_190;
  Machine local_188;
  undefined1 local_118 [8];
  Hcell hc;
  Addr local_b4;
  Machine local_a8;
  int local_38;
  undefined4 uStack_34;
  Addr addr;
  Functor *f_local;
  Machine *m_local;
  Register r_local;
  
  unique0x10000415 = f;
  Machine::Machine(&local_a8,m);
  Addr::Addr(&local_b4,r);
  a.hix_.hix = local_b4.hix_.hix;
  a.tag_ = local_b4.tag_;
  a.r_.r = local_b4.r_.r;
  AVar3 = deref(&local_a8,a);
  addr.tag_ = (AddrTag)AVar3.hix_.hix;
  hc.f_._32_8_ = AVar3._0_8_;
  _local_38 = hc.f_._32_8_;
  Machine::~Machine(&local_a8);
  Machine::Machine(&local_188,m);
  local_190 = addr.tag_;
  local_198 = local_38;
  uStack_194 = uStack_34;
  local_1a0 = addr.tag_;
  local_1a8 = local_38;
  uStack_1a4 = uStack_34;
  AVar3.hix_.hix = addr.tag_;
  AVar3.tag_ = local_38;
  AVar3.r_.r = uStack_34;
  machineAtAddr((Hcell *)local_118,&local_188,AVar3);
  Machine::~Machine(&local_188);
  if (local_118._0_4_ == Ref) {
    local_1dc = (int)Hix::operator+(&m->h,1);
    Hcell::ref(&local_1d8,(Hix)local_1dc);
    pmVar2 = std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::
             operator[](&m->heap,&m->h);
    Hcell::operator=(pmVar2,&local_1d8);
    Hcell::~Hcell(&local_1d8);
    Functor::Functor(&local_238,f);
    Hcell::functor(&local_210,&local_238);
    local_23c.hix = (int)Hix::operator+(&m->h,1);
    pmVar2 = std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::
             operator[](&m->heap,&local_23c);
    Hcell::operator=(pmVar2,&local_210);
    Hcell::~Hcell(&local_210);
    Functor::~Functor(&local_238);
    Machine::Machine(&local_320,m);
    local_328 = addr.tag_;
    local_330 = local_38;
    uStack_32c = uStack_34;
    local_340 = (m->h).hix;
    Addr::Addr(&local_33c,(Hix)local_340);
    local_348 = local_328;
    local_360[1].r_.r = local_330;
    local_360[1].hix_.hix = uStack_32c;
    local_360[0].hix_.hix = local_33c.hix_.hix;
    local_360[0].tag_ = local_33c.tag_;
    local_360[0].r_.r = local_33c.r_.r;
    bind((int)&local_2b0,(sockaddr *)&local_320,(socklen_t)_local_330);
    Machine::operator=(m,&local_2b0);
    Machine::~Machine(&local_2b0);
    Machine::~Machine(&local_320);
    Hix::operator+=(&m->h,2);
    m->mode = Write;
  }
  else if (local_118._0_4_ == Str) {
    local_364.hix = (int)Hcell::hix((Hcell *)local_118);
    pmVar2 = std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::
             operator[](&m->heap,&local_364);
    Functor::Functor(&local_3c0,f);
    Hcell::functor(&local_398,&local_3c0);
    bVar1 = Hcell::operator==(pmVar2,&local_398);
    Hcell::~Hcell(&local_398);
    Functor::~Functor(&local_3c0);
    if (bVar1) {
      Hix::operator+=(&m->s,1);
      m->mode = Read;
    }
  }
  else if (local_118._0_4_ == Functor) {
    __assert_fail("false && \"cannot call getStructure on a functor\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/bollu[P]warren-cpp/src/lzero.cpp"
                  ,0x132,"Machine getStructure(Machine, Register, Functor)");
  }
  Machine::Machine(__return_storage_ptr__,m);
  Hcell::~Hcell((Hcell *)local_118);
  return __return_storage_ptr__;
}

Assistant:

Machine getStructure(Machine m, Register r, Functor f) {
    const Addr addr = deref(m, r);
    const Hcell hc = machineAtAddr(m, addr);

    switch (hc.tag) {
        case Htag::Ref:
            m.heap[m.h] = Hcell::ref(m.h + 1);
            m.heap[m.h + 1] = Hcell::functor(f);
            m = bind(m, addr, m.h);
            m.h += 2;
            m.mode = Mode::Write;
            break;
        case Htag::Str:
            if (m.heap[hc.hix()] == Hcell::functor(f)) {
                m.s += 1;
                m.mode = Mode::Read;
            }
            break;
        case Htag::Functor:
            assert(false && "cannot call getStructure on a functor");
    }
    return m;
}